

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_face_curve_tol(REF_GRID ref_grid,REF_INT faceid,REF_DBL *curve,REF_DBL *location)

{
  REF_GEOM ref_geom;
  REF_INT *pRVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  REF_DBL hmax;
  REF_DBL slop;
  REF_DBL delta_radian;
  REF_DBL s [3];
  REF_DBL r [3];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_geom = ref_grid->geom;
  *curve = 2.0;
  *location = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  uVar5 = ref_egads_diagonal(ref_geom,-1,&local_c8);
  if (uVar5 == 0) {
    iVar6 = ref_geom->max;
    if (0 < iVar6) {
      lVar11 = 0;
      do {
        pRVar1 = ref_geom->descr;
        if ((pRVar1[lVar11 * 6] == 2) && (pRVar1[lVar11 * 6 + 1] == faceid)) {
          uVar5 = pRVar1[lVar11 * 6 + 5];
          uVar7 = (ulong)uVar5;
          if ((-1 < (int)uVar5) && (pRVar2 = ref_geom->ref_adj, (int)uVar5 < pRVar2->nnode)) {
            lVar9 = (long)pRVar2->first[uVar7];
            if (lVar9 != -1) {
              pRVar4 = pRVar2->item + lVar9;
              while( true ) {
                if (ref_geom->descr[(long)pRVar4->ref * 6] == 1) {
                  ref_geom_radian_request(ref_geom,pRVar4->ref,&local_b0);
                  local_c0 = local_c8;
                  local_78 = local_b0;
                  uStack_70 = 0;
                  uVar5 = ref_egads_face_curvature
                                    (ref_geom,(REF_INT)lVar11,&local_d0,local_48,&local_d8,local_68)
                  ;
                  if (uVar5 != 0) {
                    pcVar10 = "curve";
                    uVar8 = 0xa9e;
                    goto LAB_0014abfe;
                  }
                  if (local_d0 <= -local_d0) {
                    local_d0 = -local_d0;
                  }
                  if (local_d8 <= -local_d8) {
                    local_d8 = -local_d8;
                  }
                  if (local_d0 <= local_d8 * 0.05) {
                    local_d0 = local_d8 * 0.05;
                  }
                  uStack_90 = 0;
                  if (local_d8 <= local_d0 * 0.05) {
                    local_d8 = local_d0 * 0.05;
                  }
                  uStack_80 = 0;
                  local_a8 = local_c8;
                  uStack_a0 = 0;
                  local_98 = local_d0;
                  local_88 = local_d8;
                  uVar5 = ref_geom_reliability(ref_geom,(REF_INT)lVar11,&local_b8);
                  if (uVar5 != 0) {
                    pcVar10 = "edge tol";
                    uVar8 = 0xaaa;
                    goto LAB_0014abfe;
                  }
                  dVar13 = 1.0 / (local_c0 / local_78);
                  uVar12 = -(ulong)(dVar13 < local_98);
                  dVar14 = (double)(~uVar12 & (ulong)local_a8 |
                                   (ulong)(local_78 / local_98) & uVar12);
                  if ((dVar14 < local_b8) && (dVar14 = dVar14 / local_b8, dVar14 < *curve)) {
                    *curve = dVar14;
                    pRVar3 = ref_grid->node->real;
                    *location = pRVar3[uVar7 * 0xf];
                    location[1] = pRVar3[uVar7 * 0xf + 1];
                    location[2] = pRVar3[uVar7 * 0xf + 2];
                  }
                  uVar12 = -(ulong)(dVar13 < local_88);
                  dVar13 = (double)(~uVar12 & (ulong)local_a8 |
                                   (ulong)(local_78 / local_88) & uVar12);
                  if (dVar13 < local_b8) {
                    dVar13 = dVar13 / local_b8;
                    if (dVar13 < *curve) {
                      *curve = dVar13;
                      pRVar3 = ref_grid->node->real;
                      *location = pRVar3[uVar7 * 0xf];
                      location[1] = pRVar3[uVar7 * 0xf + 1];
                      location[2] = pRVar3[uVar7 * 0xf + 2];
                    }
                  }
                }
                pRVar4 = ref_geom->ref_adj->item;
                lVar9 = (long)pRVar4[(int)lVar9].next;
                if (lVar9 == -1) break;
                pRVar4 = pRVar4 + lVar9;
              }
              iVar6 = ref_geom->max;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar6);
    }
    uVar5 = 0;
  }
  else {
    pcVar10 = "bbox diag";
    uVar8 = 0xa94;
LAB_0014abfe:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
           "ref_geom_face_curve_tol",(ulong)uVar5,pcVar10);
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_face_curve_tol(REF_GRID ref_grid,
                                                  REF_INT faceid,
                                                  REF_DBL *curve,
                                                  REF_DBL *location) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);

  REF_INT edge_geom, node;
  REF_INT item, face_geom;
  REF_DBL hmax, delta_radian, rlimit;
  REF_DBL kr, r[3], ks, s[3];
  REF_DBL hr, hs, slop;
  REF_DBL curvature_ratio = 1.0 / 20.0;

  *curve = 2.0;
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;

  RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "bbox diag");

  each_ref_geom_face(ref_geom, face_geom) {
    if (faceid != ref_geom_id(ref_geom, face_geom)) continue;
    node = ref_geom_node(ref_geom, face_geom);
    each_ref_geom_having_node(ref_geom, node, item, edge_geom) {
      if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) continue;
      RSS(ref_geom_radian_request(ref_geom, edge_geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      RSS(ref_egads_face_curvature(ref_geom, face_geom, &kr, r, &ks, s),
          "curve");
      /* ignore sign, k is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      RSS(ref_geom_reliability(ref_geom, face_geom, &slop), "edge tol");
      if (hr < slop) {
        if (*curve > hr / slop) {
          *curve = hr / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
      if (hs < slop) {
        if (*curve > hs / slop) {
          *curve = hs / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
    }
  }
  return REF_SUCCESS;
}